

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

string * __thiscall
detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_
          (string *__return_storage_ptr__,GeneratedMakeCommand *this)

{
  pointer pbVar1;
  pointer pbVar2;
  int in_R8D;
  char *__s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view str;
  string local_a0;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  size_type local_48;
  pointer local_40;
  string *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar2 = (this->PrimaryCommand).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->PrimaryCommand).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    __s = "";
    do {
      str._M_str = (char *)0x100;
      str._M_len = (size_t)(pbVar2->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForShell_abi_cxx11_
                (&local_a0,(cmOutputConverter *)pbVar2->_M_string_length,str,in_R8D);
      local_60.first._M_len = strlen(__s);
      local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_48 = local_a0._M_string_length;
      local_40 = local_a0._M_dataplus._M_p;
      views._M_len = 2;
      views._M_array = &local_60;
      local_60.first._M_str = __s;
      local_38 = &local_a0;
      cmCatViews(&local_80,views);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      pbVar2 = pbVar2 + 1;
      __s = " ";
    } while (pbVar2 != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMakeCommand::QuotedPrintable() const
{
  std::string output;
  const char* sep = "";
  int flags = 0;
#if !defined(_WIN32)
  flags |= cmOutputConverter::Shell_Flag_IsUnix;
#endif
  for (auto const& arg : this->PrimaryCommand) {
    output += cmStrCat(sep, cmOutputConverter::EscapeForShell(arg, flags));
    sep = " ";
  }
  return output;
}